

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O0

int importCertificate(char *filePath,CK_SLOT_ID slotID,char *userPIN,char *label,char *objectID,
                     int forceExec)

{
  CK_C_Login p_Var1;
  CK_RV CVar2;
  size_t sVar3;
  CK_OBJECT_HANDLE CVar4;
  long in_RCX;
  size_t in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *in_R8;
  int in_R9D;
  CK_SESSION_HANDLE unaff_retaddr;
  int result;
  CK_OBJECT_HANDLE oHandle;
  CK_RV rv;
  CK_SESSION_HANDLE hSession;
  char *objID;
  size_t objIDLen;
  char user_pin_copy [256];
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined8 in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  CK_SESSION_HANDLE local_150;
  char *local_148;
  size_t objIDLen_00;
  char *in_stack_fffffffffffffec8;
  CK_OBJECT_CLASS in_stack_fffffffffffffed0;
  CK_SESSION_HANDLE in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar5;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  memset(&stack0xfffffffffffffec8,0,0x100);
  if (in_RCX == 0) {
    fprintf(_stderr,"ERROR: A label for the object must be supplied. Use --label <text>\n");
    iVar5 = 1;
  }
  else if (in_R8 == (char *)0x0) {
    fprintf(_stderr,"ERROR: An ID for the object must be supplied. Use --id <hex>\n");
    iVar5 = 1;
  }
  else {
    objIDLen_00 = 0;
    strlen(in_R8);
    local_148 = hexStrToBin(in_stack_fffffffffffffea8,iVar5,
                            (size_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
    ;
    if (local_148 == (char *)0x0) {
      fprintf(_stderr,"Please edit --id <hex> to correct error.\n");
      iVar5 = 1;
    }
    else {
      CVar2 = (*p11->C_OpenSession)((CK_SLOT_ID)in_RSI,6,(void *)0x0,(CK_NOTIFY)0x0,&local_150);
      if (CVar2 == 0) {
        iVar5 = getPW((char *)user_pin_copy._72_8_,(char *)user_pin_copy._64_8_,user_pin_copy._56_8_
                     );
        if (iVar5 == 0) {
          p_Var1 = p11->C_Login;
          sVar3 = strlen(&stack0xfffffffffffffec8);
          CVar2 = (*p_Var1)(local_150,1,&stack0xfffffffffffffec8,sVar3);
          if (CVar2 == 0) {
            CVar4 = searchObject(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                 in_stack_fffffffffffffec8,objIDLen_00);
            if ((CVar4 == 0) || (in_R9D != 0)) {
              crypto_init();
              iVar5 = crypto_import_certificate
                                (unaff_retaddr,
                                 (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),in_RDI,in_RSI,in_RDX);
              crypto_final();
              free(local_148);
            }
            else {
              free(local_148);
              fprintf(_stderr,
                      "ERROR: The ID is already assigned to another object. Use --force to override this message.\n"
                     );
              iVar5 = 1;
            }
          }
          else {
            if (CVar2 == 0xa0) {
              fprintf(_stderr,"ERROR: The given user PIN does not match the one in the token.\n");
            }
            else {
              fprintf(_stderr,"ERROR: Could not log in on the token.\n");
            }
            free(local_148);
            iVar5 = 1;
          }
        }
        else {
          fprintf(_stderr,"ERROR: Could not get user PIN\n");
          free(local_148);
          iVar5 = 1;
        }
      }
      else {
        if (CVar2 == 3) {
          fprintf(_stderr,"ERROR: The given slot does not exist.\n");
        }
        else {
          fprintf(_stderr,"ERROR: Could not open a session on the given slot.\n");
        }
        free(local_148);
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int importCertificate
(
	char* filePath,
	CK_SLOT_ID slotID,
	char* userPIN,
	char* label,
	char* objectID,
	int forceExec
)
{
	char user_pin_copy[MAX_PIN_LEN+1] = {0};

	if (label == NULL)
	{
		fprintf(stderr, "ERROR: A label for the object must be supplied. "
				"Use --label <text>\n");
		return 1;
	}

	if (objectID == NULL)
	{
		fprintf(stderr, "ERROR: An ID for the object must be supplied. "
				"Use --id <hex>\n");
		return 1;
	}

	size_t objIDLen = 0;
	char* objID = hexStrToBin(objectID, strlen(objectID), &objIDLen);
	if (objID == NULL)
	{
		fprintf(stderr, "Please edit --id <hex> to correct error.\n");
		return 1;
	}

	CK_SESSION_HANDLE hSession;
	CK_RV rv = p11->C_OpenSession(slotID, CKF_SERIAL_SESSION | CKF_RW_SESSION,
					NULL_PTR, NULL_PTR, &hSession);
	if (rv != CKR_OK)
	{
		if (rv == CKR_SLOT_ID_INVALID)
		{
			fprintf(stderr, "ERROR: The given slot does not exist.\n");
		}
		else
		{
			fprintf(stderr, "ERROR: Could not open a session on the given slot.\n");
		}
		free(objID);
		return 1;
	}

	// Get the password
	if (getPW(userPIN, user_pin_copy, CKU_USER) != 0)
	{
		fprintf(stderr, "ERROR: Could not get user PIN\n");
		free(objID);
		return 1;
	}

	rv = p11->C_Login(hSession, CKU_USER, (CK_UTF8CHAR_PTR)user_pin_copy, strlen(user_pin_copy));
	if (rv != CKR_OK)
	{
		if (rv == CKR_PIN_INCORRECT) {
			fprintf(stderr, "ERROR: The given user PIN does not match the one in the token.\n");
		}
		else
		{
			fprintf(stderr, "ERROR: Could not log in on the token.\n");
		}
		free(objID);
		return 1;
	}

	CK_OBJECT_HANDLE oHandle = searchObject(hSession, CKO_CERTIFICATE, objID, objIDLen);
	if (oHandle != CK_INVALID_HANDLE && forceExec == 0)
	{
		free(objID);
		fprintf(stderr, "ERROR: The ID is already assigned to another object. "
				"Use --force to override this message.\n");
		return 1;
	}

	crypto_init();
	int result = crypto_import_certificate(hSession, filePath, label, objID, objIDLen);
	crypto_final();

	free(objID);

	return result;
}